

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  UnitTestImpl *pUVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  TestSuite *pTVar7;
  size_t width;
  TimeInMillis ms;
  TimeInMillis ms_00;
  int i;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string kIndent;
  string kTestsuites;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kTestsuites,"testsuites",(allocator<char> *)&kIndent);
  Indent_abi_cxx11_(&kIndent,(internal *)0x2,width);
  std::operator<<(stream,"{\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"tests",(allocator<char> *)&local_90);
  iVar4 = UnitTest::reportable_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,&local_b8,iVar4,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"failures",(allocator<char> *)&local_90);
  iVar4 = UnitTest::failed_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,&local_b8,iVar4,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"disabled",(allocator<char> *)&local_90);
  iVar4 = UnitTest::reportable_disabled_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,&local_b8,iVar4,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"errors",(allocator<char> *)&local_90);
  OutputJsonKey(stream,&kTestsuites,&local_b8,0,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_b8);
  if (FLAGS_gtest_shuffle == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"random_seed",(allocator<char> *)&local_90);
    OutputJsonKey(stream,&kTestsuites,&local_b8,unit_test->impl_->random_seed_,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"timestamp",&local_b9);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
            (&local_90,(internal *)unit_test->impl_->start_timestamp_,ms);
  OutputJsonKey(stream,&kTestsuites,&local_b8,&local_90,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"time",&local_b9);
  FormatTimeInMillisAsDuration_abi_cxx11_
            (&local_90,(internal *)unit_test->impl_->elapsed_time_,ms_00);
  OutputJsonKey(stream,&kTestsuites,&local_b8,&local_90,&kIndent,false);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b8);
  TestPropertiesAsJson(&local_b8,&unit_test->impl_->ad_hoc_test_result_,&kIndent);
  poVar6 = std::operator<<(stream,(string *)&local_b8);
  std::operator<<(poVar6,",\n");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"name",&local_b9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"AllTests",&local_91);
  OutputJsonKey(stream,&kTestsuites,&local_b8,&local_90,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b8);
  poVar6 = std::operator<<(stream,(string *)&kIndent);
  poVar6 = std::operator<<(poVar6,"\"");
  poVar6 = std::operator<<(poVar6,(string *)&kTestsuites);
  std::operator<<(poVar6,"\": [\n");
  bVar2 = false;
  for (iVar4 = 0; pUVar1 = unit_test->impl_,
      iVar4 < (int)((ulong)((long)(pUVar1->test_suites_).
                                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pUVar1->test_suites_).
                                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3); iVar4 = iVar4 + 1
      ) {
    pTVar7 = UnitTest::GetTestSuite(unit_test,iVar4);
    iVar5 = TestSuite::reportable_test_count(pTVar7);
    if (0 < iVar5) {
      bVar3 = true;
      if (bVar2) {
        std::operator<<(stream,",\n");
        bVar3 = bVar2;
      }
      pTVar7 = UnitTest::GetTestSuite(unit_test,iVar4);
      PrintJsonTestSuite(stream,pTVar7);
      bVar2 = bVar3;
    }
  }
  bVar3 = TestResult::Failed(&pUVar1->ad_hoc_test_result_);
  if (bVar3) {
    if (bVar2) {
      std::operator<<(stream,",\n");
    }
    OutputJsonTestSuiteForTestResult(stream,&unit_test->impl_->ad_hoc_test_result_);
  }
  poVar6 = std::operator<<(stream,"\n");
  poVar6 = std::operator<<(poVar6,(string *)&kIndent);
  poVar6 = std::operator<<(poVar6,"]\n");
  std::operator<<(poVar6,"}\n");
  std::__cxx11::string::~string((string *)&kIndent);
  std::__cxx11::string::~string((string *)&kTestsuites);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG_GET(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestSuite(stream, *unit_test.GetTestSuite(i));
    }
  }

  // If there was a test failure outside of one of the test suites (like in a
  // test environment) include that in the output.
  if (unit_test.ad_hoc_test_result().Failed()) {
    if (comma) {
      *stream << ",\n";
    }
    OutputJsonTestSuiteForTestResult(stream, unit_test.ad_hoc_test_result());
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}